

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O1

void __thiscall antlr::CommonAST::CommonAST(CommonAST *this,CommonAST *other)

{
  pointer pcVar1;
  
  (this->super_BaseAST).super_AST.ref = (ASTRef *)0x0;
  (this->super_BaseAST).down.ref = (ASTRef *)0x0;
  (this->super_BaseAST).right.ref = (ASTRef *)0x0;
  (this->super_BaseAST).super_AST._vptr_AST = (_func_int **)&PTR__CommonAST_00302a08;
  this->ttype = other->ttype;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (other->text)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + (other->text)._M_string_length);
  return;
}

Assistant:

CommonAST( const CommonAST& other )
	: BaseAST(other)
	, ttype(other.ttype)
	, text(other.text)
	{
	}